

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O2

ParseLocation * __thiscall
embree::LineCommentFilter::location(ParseLocation *__return_storage_ptr__,LineCommentFilter *this)

{
  ParseLocation *pPVar1;
  
  pPVar1 = Stream<int>::loc((this->cin).ptr);
  ParseLocation::ParseLocation(__return_storage_ptr__,pPVar1);
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() { return cin->loc(); }